

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MockExpectedCallTest.cpp
# Opt level: O0

void __thiscall
TEST_MockExpectedCall_toStringForMultipleInputAndOutputParameters_Test::
~TEST_MockExpectedCall_toStringForMultipleInputAndOutputParameters_Test
          (TEST_MockExpectedCall_toStringForMultipleInputAndOutputParameters_Test *this)

{
  TEST_MockExpectedCall_toStringForMultipleInputAndOutputParameters_Test *this_local;
  
  ~TEST_MockExpectedCall_toStringForMultipleInputAndOutputParameters_Test(this);
  operator_delete(this,0x18);
  return;
}

Assistant:

TEST(MockExpectedCall, toStringForMultipleInputAndOutputParameters)
{
    int int_value = 10;
    unsigned int uint_value = 7;
    unsigned char buffer_value[3];

    MockCheckedExpectedCall expectedCall(1);
    expectedCall.withName("name");
    expectedCall.withParameter("string", "value");
    expectedCall.withParameter("integer", int_value);
    expectedCall.withParameter("unsigned-integer", uint_value);
    expectedCall.withOutputParameterReturning("buffer", buffer_value, sizeof(buffer_value));
    expectedCall.callWasMade(1);
    STRCMP_EQUAL("name -> const char* string: <value>, int integer: <10 (0xa)>, unsigned int unsigned-integer: <7 (0x7)>, "
                 "const void* buffer: <output> (expected 1 call, called 1 time)", expectedCall.callToString().asCharString());
}